

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_statfs(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_fs_t req;
  uv_fs_t uStack_1b8;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_statfs(0,&uStack_1b8,".",0);
  if (iVar1 == 0) {
    statfs_cb(&uStack_1b8);
    if (statfs_cb_count == 1) {
      iVar1 = uv_fs_statfs(loop,&uStack_1b8,".",statfs_cb);
      if (iVar1 == 0) {
        uv_run(loop,0);
        if (statfs_cb_count == 2) {
          return 0;
        }
        pcVar3 = "statfs_cb_count == 2";
        uVar2 = 0x1096;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x1094;
      }
    }
    else {
      pcVar3 = "statfs_cb_count == 1";
      uVar2 = 0x1090;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x108e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_statfs) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Test the synchronous version. */
  r = uv_fs_statfs(NULL, &req, ".", NULL);
  ASSERT(r == 0);
  statfs_cb(&req);
  ASSERT(statfs_cb_count == 1);

  /* Test the asynchronous version. */
  r = uv_fs_statfs(loop, &req, ".", statfs_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(statfs_cb_count == 2);

  return 0;
}